

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.c
# Opt level: O0

void compute_intra_yprediction
               (AV1_COMMON *cm,PREDICTION_MODE mode,BLOCK_SIZE bsize,MACROBLOCK *x,MACROBLOCKD *xd)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint8_t *puVar5;
  BLOCK_SIZE bsize_00;
  int iVar6;
  int iVar7;
  long in_RCX;
  BLOCK_SIZE in_DL;
  MACROBLOCKD *in_R8;
  TX_SIZE in_stack_0000004f;
  int in_stack_00000050;
  int in_stack_00000054;
  int in_stack_00000058;
  BLOCK_SIZE in_stack_0000005f;
  int max_blocks_high;
  int max_blocks_wide;
  BLOCK_SIZE plane_bsize;
  TX_SIZE tx_size;
  int col;
  int row;
  int plane;
  int dst_stride;
  int src_stride;
  uint8_t *dst_buf_base;
  uint8_t *src_buf_base;
  macroblock_plane *p;
  macroblockd_plane *pd;
  SequenceHeader *seq_params;
  FILTER_INTRA_MODE in_stack_000000b8;
  int in_stack_000000c8;
  uint8_t *in_stack_000000d0;
  int in_stack_000000d8;
  int in_stack_000000e0;
  int in_stack_000000e8;
  int in_stack_000000f0;
  int local_7c;
  int local_78;
  
  lVar4 = *(long *)(in_RCX + 0x30);
  puVar5 = in_R8->plane[0].dst.buf;
  iVar2 = *(int *)(in_RCX + 0x48);
  iVar3 = in_R8->plane[0].dst.stride;
  bVar1 = ""[in_DL];
  bsize_00 = get_plane_block_size(in_DL,in_R8->plane[0].subsampling_x,in_R8->plane[0].subsampling_y)
  ;
  iVar6 = max_block_wide(in_R8,bsize_00,0);
  iVar7 = max_block_high(in_R8,bsize_00,0);
  for (local_78 = 0; local_78 < iVar7; local_78 = (1 << (bVar1 & 0x1f)) + local_78) {
    for (local_7c = 0; local_7c < iVar6; local_7c = (1 << (bVar1 & 0x1f)) + local_7c) {
      *(long *)(in_RCX + 0x30) = lVar4 + ((long)local_78 * (long)iVar2 + (long)local_7c) * 4;
      in_R8->plane[0].dst.buf = puVar5 + ((long)local_78 * (long)iVar3 + (long)local_7c) * 4;
      av1_predict_intra_block
                (_max_blocks_high,in_stack_0000005f,in_stack_00000058,in_stack_00000054,
                 in_stack_00000050,in_stack_0000004f,(PREDICTION_MODE)seq_params,(int)xd,(int)x,
                 in_stack_000000b8,(uint8_t *)cm,in_stack_000000c8,in_stack_000000d0,
                 in_stack_000000d8,in_stack_000000e0,in_stack_000000e8,in_stack_000000f0);
    }
  }
  *(long *)(in_RCX + 0x30) = lVar4;
  in_R8->plane[0].dst.buf = puVar5;
  return;
}

Assistant:

static void compute_intra_yprediction(const AV1_COMMON *cm,
                                      PREDICTION_MODE mode, BLOCK_SIZE bsize,
                                      MACROBLOCK *x, MACROBLOCKD *xd) {
  const SequenceHeader *seq_params = cm->seq_params;
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];
  struct macroblock_plane *const p = &x->plane[AOM_PLANE_Y];
  uint8_t *const src_buf_base = p->src.buf;
  uint8_t *const dst_buf_base = pd->dst.buf;
  const int src_stride = p->src.stride;
  const int dst_stride = pd->dst.stride;
  int plane = 0;
  int row, col;
  // block and transform sizes, in number of 4x4 blocks log 2 ("*_b")
  // 4x4=0, 8x8=2, 16x16=4, 32x32=6, 64x64=8
  // transform size varies per plane, look it up in a common way.
  const TX_SIZE tx_size = max_txsize_lookup[bsize];
  const BLOCK_SIZE plane_bsize =
      get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);
  // If mb_to_right_edge is < 0 we are in a situation in which
  // the current block size extends into the UMV and we won't
  // visit the sub blocks that are wholly within the UMV.
  const int max_blocks_wide = max_block_wide(xd, plane_bsize, plane);
  const int max_blocks_high = max_block_high(xd, plane_bsize, plane);
  // Keep track of the row and column of the blocks we use so that we know
  // if we are in the unrestricted motion border.
  for (row = 0; row < max_blocks_high; row += (1 << tx_size)) {
    // Skip visiting the sub blocks that are wholly within the UMV.
    for (col = 0; col < max_blocks_wide; col += (1 << tx_size)) {
      p->src.buf = &src_buf_base[4 * (row * (int64_t)src_stride + col)];
      pd->dst.buf = &dst_buf_base[4 * (row * (int64_t)dst_stride + col)];
      av1_predict_intra_block(
          xd, seq_params->sb_size, seq_params->enable_intra_edge_filter,
          block_size_wide[bsize], block_size_high[bsize], tx_size, mode, 0, 0,
          FILTER_INTRA_MODES, pd->dst.buf, dst_stride, pd->dst.buf, dst_stride,
          0, 0, plane);
    }
  }
  p->src.buf = src_buf_base;
  pd->dst.buf = dst_buf_base;
}